

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

parser_error parse_entry_priority(parser *p)

{
  int iVar1;
  undefined4 uVar2;
  parser_error pVar3;
  long *plVar4;
  char *__nptr;
  long lVar5;
  int iVar6;
  long lVar7;
  char *end;
  
  plVar4 = (long *)parser_priv(p);
  if (plVar4 == (long *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __nptr = parser_getstr(p,"priority");
    iVar6 = 1;
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 0x10) {
      iVar1 = strcmp(__nptr,*(char **)((long)&priority_schemes[1].name + lVar7));
      if (iVar1 == 0) {
        uVar2 = 0;
        if (*(char *)((long)plVar4 + 0x1c) != '\x01') goto LAB_001d4bad;
        lVar7 = (**(code **)((long)&priority_schemes[1].priority + lVar7))
                          (*(undefined4 *)(*plVar4 + 0x1b4));
        goto LAB_001d4bab;
      }
      iVar6 = iVar6 + 1;
    }
    lVar5 = strtol(__nptr,&end,10);
    if ((*__nptr == '\0') || (*end != '\0')) {
      pVar3 = PARSE_ERROR_NOT_NUMBER;
    }
    else {
      lVar7 = -0x80000000;
      if (-0x80000000 < lVar5) {
        lVar7 = lVar5;
      }
      if (0x7ffffffe < lVar7) {
        lVar7 = 0x7fffffff;
      }
LAB_001d4bab:
      uVar2 = (undefined4)lVar7;
      iVar6 = 0;
LAB_001d4bad:
      lVar7 = (long)(int)plVar4[3];
      if (lVar7 == -1) {
        *(int *)((long)plVar4 + 0x14) = iVar6;
        *(undefined4 *)(*plVar4 + 0x1b0) = uVar2;
      }
      else if (*(char *)((long)plVar4 + 0x1c) == '\x01') {
        lVar5 = *(long *)(*plVar4 + 8);
        *(undefined4 *)(lVar5 + 8 + lVar7 * 0x10) = uVar2;
        *(undefined1 *)(lVar5 + 0xc + lVar7 * 0x10) = 1;
      }
      else {
        lVar5 = plVar4[1];
        lVar7 = lVar7 * 0x18;
        *(int *)(lVar5 + 8 + lVar7) = iVar6;
        *(undefined4 *)(lVar5 + 0xc + lVar7) = uVar2;
        *(undefined1 *)(lVar5 + 0x10 + lVar7) = 1;
      }
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_entry_priority(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	int psource_index = 0;
	int priority = 0;
	int n = N_ELEMENTS(priority_schemes);
	int i;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "priority");
	i = 1;
	while (1) {
		if (i >= n) {
			char *end;
			long v;

			v = strtol(name, &end, 10);
			if (! *name || *end) {
				return PARSE_ERROR_NOT_NUMBER;
			}
			priority = (v <= INT_MAX) ?
				((v >= INT_MIN) ? v : INT_MIN) : INT_MAX;
			break;
		}
		if (streq(name, priority_schemes[i].name)) {
			if (embryo->exists) {
				priority = (*priority_schemes[i].priority)(
					embryo->entry->param_index);
			} else {
				psource_index = i;
			}
			break;
		}
		++i;
	}
	if (embryo->last_category_index == -1) {
		embryo->psource_index = psource_index;
		embryo->entry->default_priority = priority;
	} else {
		if (embryo->exists) {
			embryo->entry->categories[embryo->last_category_index].priority = priority;
			embryo->entry->categories[embryo->last_category_index].priority_set = true;
		} else {
			embryo->categories[embryo->last_category_index].psource_index = psource_index;
			embryo->categories[embryo->last_category_index].priority = priority;
			embryo->categories[embryo->last_category_index].priority_set = true;
		}
	}
	return PARSE_ERROR_NONE;
}